

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# per_support.c
# Opt level: O0

int32_t per_get_few_bits(asn_per_data_t *pd,int nbits)

{
  char cVar1;
  int iVar2;
  int32_t iVar3;
  uint uVar4;
  uint in_ESI;
  asn_per_data_t *in_RDI;
  asn_per_data_t tpd;
  int32_t vhead;
  int32_t tailv;
  uint8_t *buf;
  uint32_t accum;
  ssize_t nleft;
  size_t off;
  uint local_a0;
  uint local_7c;
  asn_per_data_t local_78;
  int32_t local_44;
  byte *local_40;
  uint local_34;
  ulong local_30;
  undefined8 in_stack_ffffffffffffffd8;
  int iVar6;
  ulong uVar5;
  undefined4 in_stack_ffffffffffffffe0;
  uint local_c;
  
  iVar6 = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  if ((int)in_ESI < 0) {
    local_c = 0xffffffff;
  }
  else {
    local_30 = in_RDI->nbits - in_RDI->nboff;
    if ((long)local_30 < (long)(int)in_ESI) {
      if ((in_RDI->refill == (_func_int_asn_per_data_s_ptr *)0x0) || (0x1f < (int)in_ESI)) {
        local_c = 0xffffffff;
      }
      else {
        ASN_DEBUG("Obtain the rest %d bits (want %d)",local_30 & 0xffffffff,(ulong)in_ESI);
        local_44 = per_get_few_bits((asn_per_data_t *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),
                                    iVar6);
        if (local_44 < 0) {
          local_c = 0xffffffff;
        }
        else {
          iVar2 = (*in_RDI->refill)(in_RDI);
          if (iVar2 == 0) {
            iVar2 = in_ESI - (int)local_30;
            local_c = per_get_few_bits((asn_per_data_t *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
                                       iVar6);
            local_c = local_44 << ((byte)iVar2 & 0x1f) | local_c;
          }
          else {
            local_c = 0xffffffff;
          }
        }
      }
    }
    else {
      if (7 < in_RDI->nboff) {
        in_RDI->buffer = in_RDI->buffer + (in_RDI->nboff >> 3);
        in_RDI->nbits = in_RDI->nbits - (in_RDI->nboff & 0xfffffffffffffff8);
        in_RDI->nboff = in_RDI->nboff & 7;
      }
      in_RDI->moved = (long)(int)in_ESI + in_RDI->moved;
      in_RDI->nboff = (long)(int)in_ESI + in_RDI->nboff;
      uVar5 = in_RDI->nboff;
      local_40 = in_RDI->buffer;
      cVar1 = (char)uVar5;
      if (uVar5 < 9) {
        if (in_ESI == 0) {
          local_7c = 0;
        }
        else {
          local_7c = (int)(uint)*local_40 >> (8U - cVar1 & 0x1f);
        }
        local_34 = local_7c;
      }
      else if (uVar5 < 0x11) {
        local_34 = (int)((uint)*local_40 * 0x100 + (uint)local_40[1]) >> (0x10U - cVar1 & 0x1f);
      }
      else if (uVar5 < 0x19) {
        local_34 = (int)((uint)*local_40 * 0x10000 + (uint)local_40[1] * 0x100 + (uint)local_40[2])
                   >> (0x18U - cVar1 & 0x1f);
      }
      else if (uVar5 < 0x20) {
        local_34 = (int)((uint)*local_40 * 0x1000000 + (uint)local_40[1] * 0x10000 +
                         (uint)local_40[2] * 0x100 + (uint)local_40[3]) >> (0x20U - cVar1 & 0x1f);
      }
      else {
        if (0x1f < (int)in_ESI) {
          per_get_undo(in_RDI,in_ESI);
          return -1;
        }
        memcpy(&local_78,in_RDI,0x30);
        iVar6 = (int)(uVar5 >> 0x20);
        per_get_undo(&local_78,in_ESI);
        iVar3 = per_get_few_bits((asn_per_data_t *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),iVar6)
        ;
        local_34 = iVar3 << 0x18;
        uVar4 = per_get_few_bits((asn_per_data_t *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),iVar6)
        ;
        local_34 = uVar4 | local_34;
      }
      local_34 = (1 << ((byte)in_ESI & 0x1f)) - 1U & local_34;
      if (in_RDI->buffer == (uint8_t *)0x0) {
        local_a0 = 0;
      }
      else {
        local_a0 = (uint)*in_RDI->buffer;
      }
      ASN_DEBUG("  [PER got %2d<=%2d bits => span %d %+ld[%d..%d]:%02x (%d) => 0x%x]",(ulong)in_ESI,
                local_30 & 0xffffffff,in_RDI->moved & 0xffffffff,(ulong)in_RDI->buffer & 0xf,
                in_RDI->nboff & 0xffffffff,(int)in_RDI->nbits,local_a0,
                (int)in_RDI->nbits - (int)in_RDI->nboff,local_34);
      local_c = local_34;
    }
  }
  return local_c;
}

Assistant:

int32_t
per_get_few_bits(asn_per_data_t *pd, int nbits) {
	size_t off;	/* Next after last bit offset */
	ssize_t nleft;	/* Number of bits left in this stream */
	uint32_t accum;
	const uint8_t *buf;

	if(nbits < 0)
		return -1;

	nleft = pd->nbits - pd->nboff;
	if(nbits > nleft) {
		int32_t tailv, vhead;
		if(!pd->refill || nbits > 31) return -1;
		/* Accumulate unused bytes before refill */
		ASN_DEBUG("Obtain the rest %d bits (want %d)",
			(int)nleft, (int)nbits);
		tailv = per_get_few_bits(pd, nleft);
		if(tailv < 0) return -1;
		/* Refill (replace pd contents with new data) */
		if(pd->refill(pd))
			return -1;
		nbits -= nleft;
		vhead = per_get_few_bits(pd, nbits);
		/* Combine the rest of previous pd with the head of new one */
		tailv = (tailv << nbits) | vhead;  /* Could == -1 */
		return tailv;
	}

	/*
	 * Normalize position indicator.
	 */
	if(pd->nboff >= 8) {
		pd->buffer += (pd->nboff >> 3);
		pd->nbits  -= (pd->nboff & ~0x07);
		pd->nboff  &= 0x07;
	}
	pd->moved += nbits;
	pd->nboff += nbits;
	off = pd->nboff;
	buf = pd->buffer;

	/*
	 * Extract specified number of bits.
	 */
	if(off <= 8)
		accum = nbits ? (buf[0]) >> (8 - off) : 0;
	else if(off <= 16)
		accum = ((buf[0] << 8) + buf[1]) >> (16 - off);
	else if(off <= 24)
		accum = ((buf[0] << 16) + (buf[1] << 8) + buf[2]) >> (24 - off);
	else if(off <= 31)
		accum = ((buf[0] << 24) + (buf[1] << 16)
			+ (buf[2] << 8) + (buf[3])) >> (32 - off);
	else if(nbits <= 31) {
		asn_per_data_t tpd = *pd;
		/* Here are we with our 31-bits limit plus 1..7 bits offset. */
		per_get_undo(&tpd, nbits);
		/* The number of available bits in the stream allow
		 * for the following operations to take place without
		 * invoking the ->refill() function */
		accum  = per_get_few_bits(&tpd, nbits - 24) << 24;
		accum |= per_get_few_bits(&tpd, 24);
	} else {
		per_get_undo(pd, nbits);
		return -1;
	}

	accum &= (((uint32_t)1 << nbits) - 1);

	ASN_DEBUG("  [PER got %2d<=%2d bits => span %d %+ld[%d..%d]:%02x (%d) => 0x%x]",
		(int)nbits, (int)nleft,
		(int)pd->moved,
		(((long)pd->buffer) & 0xf),
		(int)pd->nboff, (int)pd->nbits,
		((pd->buffer != NULL)?pd->buffer[0]:0),
		(int)(pd->nbits - pd->nboff),
		(int)accum);

	return accum;
}